

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_precision.cpp
# Opt level: O1

void anon_unknown.dwarf_66499::find_lowerable_rvalues_visitor::stack_enter
               (ir_instruction *ir,void *data)

{
  vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> *this;
  byte bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  long *unaff_RBP;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  void *unaff_R15;
  stack_entry entry;
  vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> local_48;
  
  local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = *(byte *)((long)data + 0x30);
  puVar2 = *(undefined8 **)((long)data + 0x40);
  if (puVar2 == *(undefined8 **)((long)data + 0x48)) {
    puVar3 = *(undefined8 **)((long)data + 0x38);
    if ((long)puVar2 - (long)puVar3 == 0x7ffffffffffffff8) {
      uVar8 = std::__throw_length_error("vector::_M_realloc_insert");
      __cxa_begin_catch(uVar8);
      if ((unaff_R15 != (void *)0x0) || (unaff_R15 = (void *)*unaff_RBP, unaff_R15 != (void *)0x0))
      {
        operator_delete(unaff_R15);
      }
      uVar8 = __cxa_rethrow();
      __cxa_end_catch();
      if (local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar8);
    }
    lVar4 = (long)puVar2 - (long)puVar3 >> 3;
    uVar9 = lVar4 * -0x3333333333333333;
    uVar5 = 1;
    if (puVar2 != puVar3) {
      uVar5 = uVar9;
    }
    uVar10 = uVar5 + uVar9;
    if (0x333333333333332 < uVar10) {
      uVar10 = 0x333333333333333;
    }
    if (CARRY8(uVar5,uVar9)) {
      uVar10 = 0x333333333333333;
    }
    if (uVar10 == 0) {
      puVar6 = (undefined8 *)0x0;
    }
    else {
      puVar6 = (undefined8 *)operator_new(uVar10 * 0x28);
    }
    this = (vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> *)(puVar6 + lVar4 + 2);
    *(uint *)&this[-1].super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (uint)bVar1;
    this[-1].super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)ir;
    std::vector<ir_instruction_*,_std::allocator<ir_instruction_*>_>::vector(this,&local_48);
    puVar11 = puVar6;
    for (puVar7 = puVar3; puVar2 != puVar7; puVar7 = puVar7 + 5) {
      *(undefined4 *)(puVar11 + 1) = *(undefined4 *)(puVar7 + 1);
      *puVar11 = *puVar7;
      puVar11[2] = puVar7[2];
      puVar11[3] = puVar7[3];
      puVar11[4] = puVar7[4];
      puVar7[2] = 0;
      puVar7[3] = 0;
      puVar7[4] = 0;
      puVar11 = puVar11 + 5;
    }
    if (puVar3 != (undefined8 *)0x0) {
      operator_delete(puVar3);
    }
    *(undefined8 **)((long)data + 0x38) = puVar6;
    *(undefined8 **)((long)data + 0x40) = puVar11 + 5;
    *(undefined8 **)((long)data + 0x48) = puVar6 + uVar10 * 5;
  }
  else {
    *(uint *)(puVar2 + 1) = (uint)bVar1;
    *puVar2 = ir;
    std::vector<ir_instruction_*,_std::allocator<ir_instruction_*>_>::vector
              ((vector<ir_instruction_*,_std::allocator<ir_instruction_*>_> *)(puVar2 + 2),&local_48
              );
    *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + 0x28;
  }
  if (local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
find_lowerable_rvalues_visitor::stack_enter(class ir_instruction *ir,
                                            void *data)
{
   find_lowerable_rvalues_visitor *state =
      (find_lowerable_rvalues_visitor *) data;

   /* Add a new stack entry for this instruction */
   stack_entry entry;

   entry.instr = ir;
   entry.state = state->in_assignee ? CANT_LOWER : UNKNOWN;

   state->stack.push_back(entry);
}